

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O0

void paramlabel(int tabindex,char *label,int *bytecount)

{
  datatype dVar1;
  int iVar2;
  char local_25 [5];
  uint *puStack_20;
  char indexstr [5];
  int *bytecount_local;
  char *label_local;
  int tabindex_local;
  
  puStack_20 = (uint *)bytecount;
  if (*bytecount < 0) {
    dVar1 = data_class(tabindex);
    if (dVar1 == dtinteger) {
      strcpy(label,"[bp");
    }
    else {
      strcpy(label,"[bp");
    }
  }
  else {
    strcpy(label,"[bp");
  }
  if (0 < (int)*puStack_20) {
    strcat(label,"+");
  }
  sprintf(local_25,"%d",(ulong)*puStack_20);
  strcat(label,local_25);
  dVar1 = data_class(tabindex);
  iVar2 = 4;
  if (dVar1 == dtinteger) {
    iVar2 = 2;
  }
  *puStack_20 = *puStack_20 - iVar2;
  strcat(label,"]");
  strcpy(symtab[tabindex].label,label);
  return;
}

Assistant:

void	paramlabel(int tabindex, char *label, int *bytecount)
{
    char indexstr[5];
    if (*bytecount < 0)	{
        if (data_class(tabindex) == dtinteger)
            strcpy(label, "[bp");
        else
            strcpy(label, "[bp");
    }
    else
        strcpy(label, "[bp");
    if (*bytecount > 0)
        strcat(label, "+");
    //itoa(*bytecount, indexstr, 10);
    sprintf(indexstr, "%d", *bytecount);
    strcat(label, indexstr);
    *bytecount -= data_class(tabindex) == dtinteger? 2: 4;
    strcat(label, "]");
    strcpy(symtab[tabindex].label, label);
}